

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idas.c
# Opt level: O2

int IDAHandleNFlag(IDAMem IDA_mem,int nflag,sunrealtype err_k,sunrealtype err_km1,long *ncfnPtr,
                  int *ncfPtr,long *netfPtr,int *nefPtr)

{
  int iVar1;
  int iVar2;
  sunrealtype sVar3;
  double dVar4;
  double dVar5;
  
  IDA_mem->ida_phase = 1;
  if (nflag == 7) {
    iVar1 = *nefPtr;
    iVar2 = iVar1 + 1;
    *nefPtr = iVar2;
    *netfPtr = *netfPtr + 1;
    if (iVar1 == 0) {
      iVar2 = IDA_mem->ida_knew;
      if (IDA_mem->ida_kk != iVar2) {
        err_k = err_km1;
      }
      IDA_mem->ida_kk = iVar2;
      dVar4 = pow(err_k + err_k + 0.0001,-1.0 / (double)(iVar2 + 1));
      dVar5 = IDA_mem->ida_eta_low;
      if (dVar4 * 0.9 <= IDA_mem->ida_eta_low) {
        dVar5 = dVar4 * 0.9;
      }
      dVar4 = IDA_mem->ida_eta_min_ef;
      if (IDA_mem->ida_eta_min_ef <= dVar5) {
        dVar4 = dVar5;
      }
      dVar5 = IDA_mem->ida_hmin / ABS(IDA_mem->ida_hh);
      if (dVar4 <= dVar5) {
        dVar4 = dVar5;
      }
      IDA_mem->ida_eta = dVar4;
      IDA_mem->ida_hh = dVar4 * IDA_mem->ida_hh;
    }
    else {
      if (iVar2 == 2) {
        IDA_mem->ida_kk = IDA_mem->ida_knew;
        dVar4 = IDA_mem->ida_hmin / ABS(IDA_mem->ida_hh);
        dVar5 = IDA_mem->ida_eta_min_ef;
        if (IDA_mem->ida_eta_min_ef <= dVar4) {
          dVar5 = dVar4;
        }
        IDA_mem->ida_eta = dVar5;
        sVar3 = dVar5 * IDA_mem->ida_hh;
      }
      else {
        if (IDA_mem->ida_maxnef <= iVar2) {
          return -3;
        }
        IDA_mem->ida_kk = 1;
        dVar4 = IDA_mem->ida_hmin / ABS(IDA_mem->ida_hh);
        dVar5 = IDA_mem->ida_eta_min_ef;
        if (IDA_mem->ida_eta_min_ef <= dVar4) {
          dVar5 = dVar4;
        }
        IDA_mem->ida_eta = dVar5;
        sVar3 = dVar5 * IDA_mem->ida_hh;
      }
LAB_00116fa8:
      IDA_mem->ida_hh = sVar3;
    }
    iVar2 = 0x14;
  }
  else {
    iVar2 = *ncfPtr;
    *ncfPtr = iVar2 + 1;
    *ncfnPtr = *ncfnPtr + 1;
    if (nflag < 0) {
      if ((nflag + 0x33U < 0x2e) && ((0x390000100401U >> ((ulong)(nflag + 0x33U) & 0x3f) & 1) != 0))
      {
        return nflag;
      }
      return -0x11;
    }
    if (iVar2 + 1 != IDA_mem->ida_maxncf) {
      dVar5 = ABS(IDA_mem->ida_hh);
      if (IDA_mem->ida_hmin * 1.000001 < dVar5) {
        if (nflag == 5) {
          sVar3 = IDA_mem->ida_eta;
        }
        else {
          dVar5 = IDA_mem->ida_hmin / dVar5;
          sVar3 = IDA_mem->ida_eta_cf;
          if (IDA_mem->ida_eta_cf <= dVar5) {
            sVar3 = dVar5;
          }
          IDA_mem->ida_eta = sVar3;
        }
        sVar3 = IDA_mem->ida_hh * sVar3;
        goto LAB_00116fa8;
      }
    }
    if (nflag - 1U < 0xc) {
      iVar2 = *(int *)(&DAT_00130154 + (ulong)(nflag - 1U) * 4);
    }
    else {
      iVar2 = -4;
    }
  }
  return iVar2;
}

Assistant:

static int IDAHandleNFlag(IDAMem IDA_mem, int nflag, sunrealtype err_k,
                          sunrealtype err_km1, long int* ncfnPtr, int* ncfPtr,
                          long int* netfPtr, int* nefPtr)
{
  sunrealtype err_knew;

  IDA_mem->ida_phase = 1;

  if (nflag != ERROR_TEST_FAIL)
  {
    /*-----------------------
      Nonlinear solver failed
      -----------------------*/

    (*ncfPtr)++;  /* local counter for convergence failures */
    (*ncfnPtr)++; /* global counter for convergence failures */

    if (nflag < 0)
    { /* nonrecoverable failure */

      if (nflag == IDA_LSOLVE_FAIL) { return (IDA_LSOLVE_FAIL); }
      else if (nflag == IDA_LSETUP_FAIL) { return (IDA_LSETUP_FAIL); }
      else if (nflag == IDA_RES_FAIL) { return (IDA_RES_FAIL); }
      else if (nflag == IDA_CONSTR_FAIL) { return (IDA_CONSTR_FAIL); }
      else if (nflag == IDA_QRHS_FAIL) { return (IDA_QRHS_FAIL); }
      else if (nflag == IDA_SRES_FAIL) { return (IDA_SRES_FAIL); }
      else if (nflag == IDA_QSRHS_FAIL) { return (IDA_QSRHS_FAIL); }
      else { return (IDA_NLS_FAIL); }
    }
    else
    { /* recoverable failure    */

      /* Test if there were too many convergence failures or |h| = hmin */
      if ((*ncfPtr == IDA_mem->ida_maxncf) ||
          (SUNRabs(IDA_mem->ida_hh) <= IDA_mem->ida_hmin * ONEPSM))
      {
        if (nflag == IDA_RES_RECVR) { return (IDA_REP_RES_ERR); }
        if (nflag == IDA_QRHS_RECVR) { return (IDA_REP_QRHS_ERR); }
        if (nflag == IDA_SRES_RECVR) { return (IDA_REP_SRES_ERR); }
        if (nflag == IDA_QSRHS_RECVR) { return (IDA_REP_QSRHS_ERR); }
        if (nflag == IDA_CONSTR_RECVR) { return (IDA_CONSTR_FAIL); }
        return (IDA_CONV_FAIL);
      }

      /* Reduce step size for a new prediction
         Note that if nflag=IDA_CONSTR_RECVR then rr was already set in IDANls */
      if (nflag != IDA_CONSTR_RECVR)
      {
        IDA_mem->ida_eta = SUNMAX(IDA_mem->ida_eta_cf,
                                  IDA_mem->ida_hmin / SUNRabs(IDA_mem->ida_hh));
      }
      IDA_mem->ida_hh *= IDA_mem->ida_eta;

      return (PREDICT_AGAIN);
    }
  }
  else
  {
    /*-----------------
      Error Test failed
      -----------------*/

    (*nefPtr)++;  /* local counter for error test failures */
    (*netfPtr)++; /* global counter for error test failures */

    if (*nefPtr == 1)
    {
      /* On first error test failure, keep current order or lower order by one.
         Compute new stepsize based on differences of the solution. */

      err_knew = (IDA_mem->ida_kk == IDA_mem->ida_knew) ? err_k : err_km1;

      IDA_mem->ida_kk  = IDA_mem->ida_knew;
      IDA_mem->ida_eta = PT9 * SUNRpowerR(TWO * err_knew + PT0001,
                                          -ONE / (IDA_mem->ida_kk + 1));
      IDA_mem->ida_eta = SUNMAX(IDA_mem->ida_eta_min_ef,
                                SUNMIN(IDA_mem->ida_eta_low, IDA_mem->ida_eta));
      IDA_mem->ida_eta = SUNMAX(IDA_mem->ida_eta,
                                IDA_mem->ida_hmin / SUNRabs(IDA_mem->ida_hh));
      IDA_mem->ida_hh *= IDA_mem->ida_eta;

      SUNLogDebug(IDA_LOGGER, "first-error-test_fail",
                  "kk = %i, eta = " SUN_FORMAT_G ", h = " SUN_FORMAT_G,
                  IDA_mem->ida_kk, IDA_mem->ida_eta, IDA_mem->ida_hh);

      return (PREDICT_AGAIN);
    }
    else if (*nefPtr == 2)
    {
      /* On second error test failure, use current order or decrease order by one.
         Reduce stepsize by factor of 1/4. */

      IDA_mem->ida_kk  = IDA_mem->ida_knew;
      IDA_mem->ida_eta = SUNMAX(IDA_mem->ida_eta_min_ef,
                                IDA_mem->ida_hmin / SUNRabs(IDA_mem->ida_hh));
      IDA_mem->ida_hh *= IDA_mem->ida_eta;

      SUNLogDebug(IDA_LOGGER, "second-error-test-fail",
                  "kk = %i, eta = " SUN_FORMAT_G ", h = " SUN_FORMAT_G,
                  IDA_mem->ida_kk, IDA_mem->ida_eta, IDA_mem->ida_hh);

      return (PREDICT_AGAIN);
    }
    else if (*nefPtr < IDA_mem->ida_maxnef)
    {
      /* On third and subsequent error test failures, set order to 1.
         Reduce stepsize by factor of 1/4. */
      IDA_mem->ida_kk  = 1;
      IDA_mem->ida_eta = SUNMAX(IDA_mem->ida_eta_min_ef,
                                IDA_mem->ida_hmin / SUNRabs(IDA_mem->ida_hh));
      IDA_mem->ida_hh *= IDA_mem->ida_eta;

      SUNLogDebug(IDA_LOGGER, "error-test-fail",
                  "kk = %i, eta = " SUN_FORMAT_G ", h = " SUN_FORMAT_G,
                  IDA_mem->ida_kk, IDA_mem->ida_eta, IDA_mem->ida_hh);

      return (PREDICT_AGAIN);
    }
    else
    {
      /* Too many error test failures */
      return (IDA_ERR_FAIL);
    }
  }
}